

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::InternalFillFromPrototype
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end,uint32 count)

{
  ScriptContext *requestContext;
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  uint32 uVar5;
  int iVar6;
  RecyclableObject *instance;
  JavascriptArray *obj;
  void *pvVar7;
  DynamicObject *pDVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  Var local_b8;
  undefined1 local_b0 [8];
  ES5ArrayIndexStaticEnumerator<true> e;
  void *local_80;
  Var oldValue;
  JsReentLock jsReentLock;
  
  instance = RecyclableObject::GetPrototype((RecyclableObject *)srcArray);
  if (count + start != end) {
    jsReentLock._24_8_ = __tls_get_addr(&PTR_01548f08);
    iVar3 = dstIndex - start;
    do {
      BVar4 = JavascriptOperators::IsNull(instance);
      if (BVar4 != 0) {
        return;
      }
      oldValue = ((((((srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.type.
                     ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                 ->threadContext;
      jsReentLock.m_threadContext = (ThreadContext *)0x0;
      jsReentLock.m_arrayObject = (Var)0x0;
      jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)oldValue)->noJsReentrancy;
      ((ThreadContext *)oldValue)->noJsReentrancy = true;
      JsReentLock::setObjectForMutation((JsReentLock *)&oldValue,srcArray);
      JsReentLock::setSecondObjectForMutation((JsReentLock *)&oldValue,dstArray);
      bVar2 = DynamicObject::IsAnyArray(instance);
      if ((!bVar2) && (BVar4 = JavascriptOperators::IsObject(instance), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)jsReentLock._24_8_ = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x2a76,
                                    "(DynamicObject::IsAnyArray(obj) || JavascriptOperators::IsObject(obj))"
                                    ,
                                    "DynamicObject::IsAnyArray(obj) || JavascriptOperators::IsObject(obj)"
                                   );
        if (!bVar2) goto LAB_00b6bf81;
        *(undefined4 *)jsReentLock._24_8_ = 0;
      }
      bVar2 = DynamicObject::IsAnyArray(instance);
      if (bVar2) {
        obj = UnsafeFromAnyArray(instance);
LAB_00b6bbd0:
        if (obj != (JavascriptArray *)0x0) {
          bVar2 = IsNonES5Array(obj);
          if (bVar2) {
            EnsureNonNativeArray(obj);
            ArrayElementEnumerator::ArrayElementEnumerator
                      ((ArrayElementEnumerator *)local_b0,obj,start,end);
LAB_00b6bc09:
            if (local_b0 != (undefined1  [8])0x0) {
              uVar10 = (ulong)(uint)e.m_array;
              uVar9 = e.m_array._4_4_;
              while( true ) {
                uVar11 = (int)uVar10 + 1;
                if (uVar11 < uVar9) {
                  uVar11 = uVar9;
                }
                while (uVar11 - 1 != (int)uVar10) {
                  uVar9 = (int)uVar10 + 1;
                  uVar10 = (ulong)uVar9;
                  if (*(undefined1 **)
                       (&((anon_union_8_2_815e7e51_for_DynamicObject_2 *)
                         &((SparseArraySegmentBase *)((long)local_b0 + 0x18))->left)->field_1 +
                       uVar10 * 2) != &DAT_40002fff80002) {
                    e.m_array._0_4_ = uVar9;
                    uVar5 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_b0);
                    iVar6 = (*(srcArray->super_ArrayObject).super_DynamicObject.
                              super_RecyclableObject.super_FinalizableObject.
                              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                                      (srcArray,(ulong)uVar5,&local_80,
                                       (((((srcArray->super_ArrayObject).super_DynamicObject.
                                           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
                                       ->super_JavascriptLibraryBase).scriptContext.ptr);
                    if ((iVar6 == 0) &&
                       ((dstArray == (JavascriptArray *)0x0 ||
                        (BVar4 = DirectGetItemAt<void*>(dstArray,iVar3 + uVar5,&local_80),
                        BVar4 == 0)))) {
                      *(undefined1 *)((long)oldValue + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                      pvVar7 = ArrayElementEnumerator::GetItem<void*>
                                         ((ArrayElementEnumerator *)local_b0);
                      (*(dstArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[0x29])
                                (dstArray,(ulong)(uVar5 + iVar3),pvVar7,0);
                      JsReentLock::MutateArrayObject((JsReentLock *)&oldValue);
                      count = count + 1;
                      *(undefined1 *)((long)oldValue + 0x108) = 1;
                    }
                    goto LAB_00b6bc09;
                  }
                }
                local_b0 = (undefined1  [8])((Type *)((long)local_b0 + 0x10))->ptr;
                if ((local_b0 == (undefined1  [8])0x0) ||
                   (uVar11 = e.m_index -
                             *(int *)&(((JavascriptArray *)
                                       &((SparseArraySegmentBase *)local_b0)->left)->
                                      super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                                      super_FinalizableObject.super_IRecyclerVisitedObject.
                                      _vptr_IRecyclerVisitedObject,
                   e.m_index <
                   *(uint *)&(((JavascriptArray *)&((SparseArraySegmentBase *)local_b0)->left)->
                             super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                             super_FinalizableObject.super_IRecyclerVisitedObject.
                             _vptr_IRecyclerVisitedObject || uVar11 == 0)) break;
                e.m_array._0_4_ = 0xffffffff;
                uVar9 = ((SparseArraySegmentBase *)local_b0)->length;
                if (uVar11 < ((SparseArraySegmentBase *)local_b0)->length) {
                  uVar9 = uVar11;
                }
                e.m_array._4_4_ = uVar9;
                uVar10 = 0xffffffff;
              }
            }
          }
          else {
            requestContext =
                 (((((instance->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                 scriptContext.ptr;
            bVar2 = VarIs<Js::ES5Array,Js::JavascriptArray>(obj);
            if (!bVar2) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *(undefined4 *)jsReentLock._24_8_ = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x2a9d,"(VarIs<ES5Array>(arr))","VarIs<ES5Array>(arr)");
              if (!bVar2) {
LAB_00b6bf81:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *(undefined4 *)jsReentLock._24_8_ = 0;
            }
            local_b0 = (undefined1  [8])VarTo<Js::ES5Array,Js::JavascriptArray>(obj);
            e.m_array._0_4_ = ((SparseArraySegmentBase *)((long)local_b0 + 0x18))->size;
            e._4_8_ = 0xffffffffffffffff;
            e.m_index = 0xffffffff;
            e.m_dataIndex = 0;
            e.m_descriptorIndex = 0;
            e.m_descriptor = (IndexPropertyDescriptor *)0x0;
            while (bVar2 = ES5ArrayIndexStaticEnumerator<true>::MoveNext
                                     ((ES5ArrayIndexStaticEnumerator<true> *)local_b0,
                                      (PropertyAttributes *)0x0), bVar2) {
              uVar9 = e.m_array._4_4_;
              if (start <= e.m_array._4_4_) {
                if (end <= e.m_array._4_4_) break;
                iVar6 = (*(srcArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                          super_FinalizableObject.super_IRecyclerVisitedObject.
                          _vptr_IRecyclerVisitedObject[0x70])
                                  (srcArray,e._4_8_ & 0xffffffff,&local_80,
                                   (((((srcArray->super_ArrayObject).super_DynamicObject.
                                       super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                                   super_JavascriptLibraryBase).scriptContext.ptr);
                if ((iVar6 == 0) &&
                   ((dstArray == (JavascriptArray *)0x0 ||
                    (BVar4 = DirectGetItemAt<void*>(dstArray,iVar3 + uVar9,&local_80), BVar4 == 0)))
                   ) {
                  local_b8 = (Var)0x0;
                  *(undefined1 *)((long)oldValue + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                  e.m_descriptorValidationToken._4_4_ =
                       JavascriptOperators::GetOwnItem(instance,uVar9,&local_b8,requestContext);
                  JsReentLock::MutateArrayObject((JsReentLock *)&oldValue);
                  *(undefined1 *)((long)oldValue + 0x108) = 1;
                  if (e.m_descriptorValidationToken._4_4_ != 0) {
                    *(undefined1 *)((long)oldValue + 0x108) = jsReentLock.m_arrayObject2._0_1_;
                    (*(dstArray->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x29])
                              (dstArray,(ulong)(uVar9 + iVar3),local_b8,0);
                    JsReentLock::MutateArrayObject((JsReentLock *)&oldValue);
                    count = count + 1;
                    *(undefined1 *)((long)oldValue + 0x108) = 1;
                  }
                }
              }
            }
          }
        }
      }
      else {
        bVar2 = DynamicType::Is(((instance->type).ptr)->typeId);
        if (bVar2) {
          pDVar8 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(instance);
          bVar2 = DynamicObject::HasObjectArray(pDVar8);
          pDVar8 = *(DynamicObject **)&(pDVar8->field_1).field_1;
          if ((bVar2 && pDVar8 != (DynamicObject *)0x0) &&
             (bVar2 = DynamicObject::IsAnyArray(pDVar8), bVar2)) {
            obj = UnsafeFromAnyArray(pDVar8);
            goto LAB_00b6bbd0;
          }
        }
      }
      *(undefined1 *)((long)oldValue + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      instance = RecyclableObject::GetPrototype(instance);
    } while (count + start != end);
  }
  return;
}

Assistant:

void JavascriptArray::InternalFillFromPrototype(JavascriptArray *dstArray, uint32 dstIndex, JavascriptArray *srcArray, uint32 start, uint32 end, uint32 count)
    {
        RecyclableObject* prototype = srcArray->GetPrototype();
        while (start + count != end && !JavascriptOperators::IsNull(prototype))
        {
            ForEachOwnMissingArrayIndexOfObject(srcArray, dstArray, prototype, start, end, dstIndex, [&](uint32 index, Var value) {
                uint32 n = dstIndex + (index - start);
                dstArray->SetItem(n, value, PropertyOperation_None);

                count++;
            });

            prototype = prototype->GetPrototype();
        }
    }